

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::DefaultsTest::iterate(DefaultsTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  GLint local_13c;
  GLint local_138;
  GLint value_dst_17;
  GLint value_ref_17;
  GLenum name_17;
  GLint value_dst_16;
  GLint value_ref_16;
  GLenum name_16;
  GLint value_dst_15;
  GLint value_ref_15;
  GLenum name_15;
  GLint value_dst_14;
  GLint value_ref_14;
  GLenum name_14;
  GLint value_dst_13;
  GLint value_ref_13;
  GLenum name_13;
  GLint value_dst_12;
  GLint value_ref_12;
  GLenum name_12;
  GLint value_dst_11;
  GLint value_ref_11;
  GLenum name_11;
  GLint value_dst_10;
  GLint value_ref_10;
  GLenum name_10;
  GLint value_dst_9;
  GLint value_ref_9;
  GLenum name_9;
  GLint value_dst_8;
  GLint value_ref_8;
  GLenum name_8;
  GLint value_dst_7;
  GLint value_ref_7;
  GLenum name_7;
  GLint value_dst_6;
  GLint value_ref_6;
  GLenum name_6;
  GLfloat value_dst_5;
  GLfloat value_ref_5;
  GLenum name_5;
  GLint value_dst_4;
  GLint value_ref_4;
  GLenum name_4;
  GLint value_dst_3;
  GLint value_ref_3;
  GLenum name_3;
  GLfloat value_dst_2 [4];
  GLfloat value_ref_2 [4];
  GLint local_5c;
  GLenum name_2;
  GLint value_dst_1;
  GLint value_ref_1;
  GLenum name_1;
  GLint value_dst;
  GLint value_ref;
  GLenum name;
  int local_34;
  byte local_2f;
  byte local_2e;
  undefined1 local_2d;
  GLuint texture;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  DefaultsTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar4->_vptr_RenderContext[2])();
  texture = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)texture);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_2d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)local_2d)) {
    local_2e = 1;
    local_2f = 0;
    local_34 = 0;
    (**(code **)(lStack_20 + 0x400))(0x806f,1,&local_34);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x187a);
    value_dst = 0x90ea;
    name_1 = 0x1902;
    value_ref_1 = 0;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x90ea,&value_ref_1);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1882);
    bVar1 = CompareAndLog(this,name_1,value_ref_1,value_dst);
    local_2e = bVar1 & local_2e;
    value_dst_1 = 0x813c;
    name_2 = 0;
    local_5c = 1;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x813c,&local_5c);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x188d);
    bVar1 = CompareAndLog(this,name_2,local_5c,value_dst_1);
    local_2e = bVar1 & local_2e;
    value_dst_2[2] = 0.0;
    value_dst_2[3] = 0.0;
    _value_ref_3 = 0;
    value_dst_2[0] = 0.0;
    value_dst_2[1] = 0.0;
    (**(code **)(lStack_20 + 0xb00))(local_34,0x1004,&value_ref_3);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1898);
    bVar1 = CompareAndLog(this,value_dst_2 + 2,(GLfloat *)&value_ref_3,0x1004);
    local_2e = bVar1 & local_2e;
    value_dst_3 = 0x884d;
    name_4 = 0x203;
    value_ref_4 = 0;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x884d,&value_ref_4);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18a3);
    bVar1 = CompareAndLog(this,name_4,value_ref_4,value_dst_3);
    local_2e = bVar1 & local_2e;
    value_dst_4 = 0x884c;
    name_5 = 0;
    value_ref_5 = 0.0;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x884c,&value_ref_5);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18ae);
    bVar1 = CompareAndLog(this,name_5,(GLint)value_ref_5,value_dst_4);
    local_2e = bVar1 & local_2e;
    value_dst_5 = 4.77128e-41;
    name_6 = 0;
    value_ref_6 = 0;
    (**(code **)(lStack_20 + 0xb00))(local_34,0x8501,&value_ref_6);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18b9);
    bVar1 = CompareAndLog(this,(GLfloat)name_6,(GLfloat)value_ref_6,(GLenum)value_dst_5);
    local_2e = bVar1 & local_2e;
    value_dst_6 = 0x2801;
    name_7 = 0x2702;
    value_ref_7 = 0;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x2801,&value_ref_7);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18c4);
    bVar1 = CompareAndLog(this,name_7,value_ref_7,value_dst_6);
    local_2e = bVar1 & local_2e;
    value_dst_7 = 0x2800;
    name_8 = 0x2601;
    value_ref_8 = 0;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x2800,&value_ref_8);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18cf);
    bVar1 = CompareAndLog(this,name_8,value_ref_8,value_dst_7);
    local_2e = bVar1 & local_2e;
    value_dst_8 = 0x813a;
    name_9 = 0xfffffc18;
    value_ref_9 = 0;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x813a,&value_ref_9);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18da);
    bVar1 = CompareAndLog(this,name_9,value_ref_9,value_dst_8);
    local_2e = bVar1 & local_2e;
    value_dst_9 = 0x813b;
    name_10 = 1000;
    value_ref_10 = 0;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x813b,&value_ref_10);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18e5);
    bVar1 = CompareAndLog(this,name_10,value_ref_10,value_dst_9);
    local_2e = bVar1 & local_2e;
    value_dst_10 = 0x813d;
    name_11 = 1000;
    value_ref_11 = 0;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x813d,&value_ref_11);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18f0);
    bVar1 = CompareAndLog(this,name_11,value_ref_11,value_dst_10);
    local_2e = bVar1 & local_2e;
    value_dst_11 = 0x8e42;
    name_12 = 0x1903;
    value_ref_12 = 0;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x8e42,&value_ref_12);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18fb);
    bVar1 = CompareAndLog(this,name_12,value_ref_12,value_dst_11);
    local_2e = bVar1 & local_2e;
    value_dst_12 = 0x8e43;
    name_13 = 0x1904;
    value_ref_13 = 0;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x8e43,&value_ref_13);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1906);
    bVar1 = CompareAndLog(this,name_13,value_ref_13,value_dst_12);
    local_2e = bVar1 & local_2e;
    value_dst_13 = 0x8e44;
    name_14 = 0x1905;
    value_ref_14 = 0;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x8e44,&value_ref_14);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1911);
    bVar1 = CompareAndLog(this,name_14,value_ref_14,value_dst_13);
    local_2e = bVar1 & local_2e;
    value_dst_14 = 0x8e45;
    name_15 = 0x1906;
    value_ref_15 = 0;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x8e45,&value_ref_15);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x191c);
    bVar1 = CompareAndLog(this,name_15,value_ref_15,value_dst_14);
    local_2e = bVar1 & local_2e;
    value_dst_15 = 0x2802;
    name_16 = 0x2901;
    value_ref_16 = 0xb;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x2802,&value_ref_16);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1927);
    bVar1 = CompareAndLog(this,name_16,value_ref_16,value_dst_15);
    local_2e = bVar1 & local_2e;
    value_dst_16 = 0x2803;
    name_17 = 0x2901;
    value_ref_17 = 0xb;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x2803,&value_ref_17);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1932);
    bVar1 = CompareAndLog(this,name_17,value_ref_17,value_dst_16);
    local_2e = bVar1 & local_2e;
    value_dst_17 = 0x8072;
    local_138 = 0x2901;
    local_13c = 0xb;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x8072,&local_13c);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x193d);
    bVar1 = CompareAndLog(this,local_138,local_13c,value_dst_17);
    local_2e = (local_2e & 1 & bVar1) != 0;
    if (local_34 != 0) {
      (**(code **)(lStack_20 + 0x480))(1);
    }
    do {
      iVar2 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar2 != 0);
    if ((local_2e & 1) == 0) {
      if ((local_2f & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DefaultsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Texture. */
	glw::GLuint texture = 0;

	try
	{
		gl.createTextures(GL_TEXTURE_3D, 1, &texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		{
			glw::GLenum name	  = GL_DEPTH_STENCIL_TEXTURE_MODE;
			glw::GLint  value_ref = GL_DEPTH_COMPONENT;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_BASE_LEVEL;
			glw::GLint  value_ref = 0;
			glw::GLint  value_dst = 1;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum  name		  = GL_TEXTURE_BORDER_COLOR;
			glw::GLfloat value_ref[4] = { 0.f, 0.f, 0.f, 0.f };
			glw::GLfloat value_dst[4] = {};

			gl.getTextureParameterfv(texture, name, value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_COMPARE_FUNC;
			glw::GLint  value_ref = GL_LEQUAL;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_COMPARE_MODE;
			glw::GLint  value_ref = GL_NONE;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum  name	  = GL_TEXTURE_LOD_BIAS;
			glw::GLfloat value_ref = 0.f;
			glw::GLfloat value_dst = 0.f;

			gl.getTextureParameterfv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MIN_FILTER;
			glw::GLint  value_ref = GL_NEAREST_MIPMAP_LINEAR;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MAG_FILTER;
			glw::GLint  value_ref = GL_LINEAR;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MIN_LOD;
			glw::GLint  value_ref = -1000;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MAX_LOD;
			glw::GLint  value_ref = 1000;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MAX_LEVEL;
			glw::GLint  value_ref = 1000;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_R;
			glw::GLint  value_ref = GL_RED;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_G;
			glw::GLint  value_ref = GL_GREEN;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_B;
			glw::GLint  value_ref = GL_BLUE;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_A;
			glw::GLint  value_ref = GL_ALPHA;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_WRAP_S;
			glw::GLint  value_ref = GL_REPEAT;
			glw::GLint  value_dst = 11;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_WRAP_T;
			glw::GLint  value_ref = GL_REPEAT;
			glw::GLint  value_dst = 11;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_WRAP_R;
			glw::GLint  value_ref = GL_REPEAT;
			glw::GLint  value_dst = 11;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture)
	{
		gl.deleteTextures(1, &texture);
	}

	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}